

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

basic_message<char> * __thiscall
booster::locale::basic_message<char>::operator=
          (basic_message<char> *this,basic_message<char> *other)

{
  basic_message<char> *in_RSI;
  basic_message<char> *in_RDI;
  basic_message<char> tmp;
  basic_message<char> *other_00;
  basic_message<char> *in_stack_ffffffffffffff68;
  basic_message<char> *in_stack_ffffffffffffff70;
  basic_message<char> *local_8;
  
  local_8 = in_RDI;
  if (in_RDI != in_RSI) {
    other_00 = (basic_message<char> *)&stack0xffffffffffffff68;
    basic_message(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    swap(in_RDI,other_00);
    ~basic_message(in_RDI);
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

basic_message const &operator=(basic_message const &other)
            {
                if(this==&other) {
                    return *this;
                }
                basic_message tmp(other);
                swap(tmp);
                return *this;
            }